

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectArcLength.cpp
# Opt level: O0

double GeoCalcs::DirectArcLength
                 (LLPoint *center,double dRadius,double dStartCrs,double dEndCrs,int nOrient,
                 double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double R;
  double dSubtendedAngle;
  double dTol_local;
  int nOrient_local;
  double dEndCrs_local;
  double dStartCrs_local;
  double dRadius_local;
  LLPoint *center_local;
  
  dVar1 = GetArcExtent(dStartCrs,dEndCrs,nOrient,dTol);
  dVar2 = GeometricMeanMeridional(center->latitude);
  dVar3 = PrimeVerticalCurvature(center->latitude);
  dVar2 = sqrt(dVar2 * dVar3);
  dVar3 = sin(dRadius / dVar2);
  return ABS(dVar1 * dVar2 * dVar3);
}

Assistant:

double DirectArcLength(const LLPoint &center, double dRadius, double dStartCrs, double dEndCrs,
                           int nOrient, double dTol)
    {
        const double dSubtendedAngle = GetArcExtent(dStartCrs, dEndCrs, nOrient, dTol);
        const double R = sqrt(GeometricMeanMeridional(center.latitude) * PrimeVerticalCurvature(center.latitude));
        return fabs(dSubtendedAngle * R * sin(dRadius / R));
    }